

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string,duckdb::PhysicalType>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
                   PhysicalType params)

{
  value_type *in_RCX;
  string *in_RDI;
  string *this;
  string local_80 [8];
  string *in_stack_ffffffffffffff88;
  PhysicalType in_stack_ffffffffffffffaf;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  this = in_RDI;
  ::std::__cxx11::string::string(local_80,(string *)in_RCX);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>(in_stack_ffffffffffffff88);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,in_RCX);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x36fb11);
  ::std::__cxx11::string::~string(local_80);
  ConstructMessageRecursive<duckdb::PhysicalType>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}